

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

longlong turbo_linecount_file(char *filename,tlc_error_t *error,char **errorstring)

{
  tlc_linecount_t tVar1;
  char *pcVar2;
  tlc_string_t errstr;
  tlc_string_t local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  tVar1 = TURBOLINECOUNT::CLineCount::LineCount(filename,error,&local_30);
  if (errorstring != (char **)0x0) {
    pcVar2 = strdup(local_30._M_dataplus._M_p);
    *errorstring = pcVar2;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return tVar1;
}

Assistant:

long long turbo_linecount_file(const char *filename, tlc_error_t * error, char ** errorstring)
#endif
{
	TURBOLINECOUNT::tlc_string_t errstr;

	long long linecount = TURBOLINECOUNT::CLineCount::LineCount(filename, error, &errstr);

	if (errorstring)
	{
		*errorstring = _tcsdup(errstr.c_str());
	}

	return linecount;
}